

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

void Iso_ManRehashClassNodes(Iso_Man_t *p)

{
  int iVar1;
  Iso_Obj_t *pIso_00;
  void *pvVar2;
  int local_24;
  Iso_Obj_t *pIStack_20;
  int i;
  Iso_Obj_t *pTemp;
  Iso_Obj_t *pIso;
  Iso_Man_t *p_local;
  
  Vec_PtrClear(p->vTemp1);
  Vec_PtrClear(p->vTemp2);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vClasses), local_24 < iVar1; local_24 = local_24 + 1) {
    for (pIStack_20 = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,local_24);
        pIStack_20 != (Iso_Obj_t *)0x0; pIStack_20 = Iso_ManObj(p,pIStack_20->iClass)) {
      if (pIStack_20->Id == 0) {
        Vec_PtrPush(p->vTemp1,pIStack_20);
      }
      else {
        Vec_PtrPush(p->vTemp2,pIStack_20);
      }
    }
  }
  p->nClasses = 0;
  p->nEntries = 0;
  p->nSingles = 0;
  memset(p->pBins,0,(long)p->nBins << 2);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vTemp1), local_24 < iVar1; local_24 = local_24 + 1) {
    pIso_00 = (Iso_Obj_t *)Vec_PtrEntry(p->vTemp1,local_24);
    if (pIso_00->Id != 0) {
      __assert_fail("pTemp->Id == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                    ,0x3d8,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
    }
    pIso_00->iNext = 0;
    pIso_00->iClass = 0;
    Iso_ObjHashAdd(p,pIso_00);
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vTemp2);
    if (iVar1 <= local_24) {
      Iso_ManCollectClasses(p);
      return;
    }
    pvVar2 = Vec_PtrEntry(p->vTemp2,local_24);
    if (*(int *)((long)pvVar2 + 0x14) == 0) break;
    *(undefined4 *)((long)pvVar2 + 0xc) = 0;
    *(undefined4 *)((long)pvVar2 + 0x10) = 0;
    local_24 = local_24 + 1;
  }
  __assert_fail("pTemp->Id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x3de,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
}

Assistant:

void Iso_ManRehashClassNodes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i;
    // collect nodes
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            if ( pTemp->Id == 0 )
                Vec_PtrPush( p->vTemp1, pTemp );
            else
                Vec_PtrPush( p->vTemp2, pTemp );
    }
    // clean and add nodes
    p->nClasses = 0;       // total number of classes
    p->nEntries = 0;       // total number of entries
    p->nSingles = 0;       // total number of singletons
    memset( p->pBins, 0, sizeof(int) * p->nBins );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp1, pTemp, i )
    {
        assert( pTemp->Id == 0 );
        pTemp->iClass = pTemp->iNext = 0;
        Iso_ObjHashAdd( p, pTemp );
    }
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp2, pTemp, i )
    {
        assert( pTemp->Id != 0 );
        pTemp->iClass = pTemp->iNext = 0;
    }
    // collect new classes
    Iso_ManCollectClasses( p );
}